

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator * __thiscall
QMultiHash<unsigned_long_long,QOpenGL2GradientCache::CacheInfo>::
emplace<QOpenGL2GradientCache::CacheInfo_const&>
          (iterator *__return_storage_ptr__,void *this,unsigned_long_long *key,CacheInfo *args)

{
  Data *pDVar1;
  Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_> *pDVar2;
  long in_FS_OFFSET;
  CacheInfo local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *this;
  if (pDVar1 == (Data *)0x0) {
    local_68.stops.d.d = *(Data **)((long)this + 8);
LAB_0013fdf2:
    pDVar2 = *this;
    local_68._0_8_ = pDVar1;
    if ((pDVar2 == (Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_>
                    *)0x0) ||
       (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar2 = QHashPrivate::
               Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_>
               ::detached(pDVar2);
      *(Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_> **)this
           = pDVar2;
    }
    emplace_helper<QOpenGL2GradientCache::CacheInfo_const&>(__return_storage_ptr__,this,key,args);
    QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::~QMultiHash
              ((QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *)&local_68);
  }
  else {
    if (1 < *(uint *)&pDVar1->ref) {
      local_68.stops.d.d = *(Data **)((long)this + 8);
      if ((pDVar1 != (Data *)0x0) && (*(uint *)&pDVar1->ref != 0xffffffff)) {
        LOCK();
        pDVar1->ref = (RefCount)(*(uint *)&pDVar1->ref + 1);
        UNLOCK();
      }
      goto LAB_0013fdf2;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        emplace_helper<QOpenGL2GradientCache::CacheInfo_const&>
                  (__return_storage_ptr__,this,key,args);
        return __return_storage_ptr__;
      }
      goto LAB_0013febd;
    }
    local_68.texId = args->texId;
    local_68.stops.d.d = (args->stops).d.d;
    local_68.stops.d.ptr = (args->stops).d.ptr;
    local_68.stops.d.size = (args->stops).d.size;
    if (&(local_68.stops.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_68.stops.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_68.stops.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_68.interpolationMode = args->interpolationMode;
    local_68.opacity = args->opacity;
    QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::
    emplace_helper<QOpenGL2GradientCache::CacheInfo>
              (__return_storage_ptr__,
               (QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *)this,key,
               &local_68);
    if (&(local_68.stops.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.stops.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.stops.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_68.stops.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_68.stops.d.d)->super_QArrayData,0x18,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_0013febd:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }